

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int glfwUpdateGamepadMappings(char *string)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  ushort **ppuVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  _GLFWmapping *p_Var17;
  char cVar18;
  char cVar19;
  char *pcVar20;
  long lVar21;
  char *pcVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  _GLFWmapping mapping;
  char line [1024];
  char *local_6a8;
  undefined4 local_69c;
  ushort **local_698;
  byte local_68d [128];
  undefined8 local_60d;
  undefined8 uStack_605;
  undefined8 local_5fd;
  undefined8 uStack_5f5;
  undefined1 local_5ec [4];
  undefined1 local_5e8 [4];
  undefined1 local_5e4 [4];
  undefined1 local_5e0 [4];
  undefined1 local_5dc [4];
  undefined1 local_5d8 [4];
  undefined1 local_5d4 [4];
  undefined1 local_5d0 [4];
  undefined1 local_5cc [4];
  undefined1 local_5c8 [4];
  undefined1 local_5c4 [4];
  undefined1 local_5c0 [4];
  undefined1 local_5bc [4];
  undefined1 local_5b8 [4];
  undefined1 local_5b4 [4];
  undefined1 local_5b0 [4];
  undefined1 local_5ac [4];
  undefined1 local_5a8 [4];
  undefined1 local_5a4 [4];
  undefined8 local_5a0;
  char *local_598 [35];
  long local_480;
  char *local_478;
  undefined1 *local_470;
  char *local_468;
  undefined1 *local_460;
  char *local_458;
  undefined1 *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  char local_418;
  char local_417 [999];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/input.c"
                  ,0x43d,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar11 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cVar19 = *string;
    if (cVar19 != '\0') {
      ppuVar12 = __ctype_b_loc();
      local_698 = ppuVar12;
      do {
        if ((*(byte *)((long)*ppuVar12 + (long)cVar19 * 2 + 1) & 0x10) == 0) {
          sVar13 = strcspn(string,"\r\n");
          sVar14 = strspn(string + sVar13,"\r\n");
          string = string + sVar13 + sVar14;
        }
        else {
          sVar13 = strcspn(string,"\r\n");
          if (sVar13 < 0x400) {
            memset(local_68d,0,0xf5);
            memcpy(&local_438,string,sVar13);
            *(undefined1 *)((long)&local_438 + sVar13) = 0;
            local_598[0] = "platform";
            local_598[1] = (char *)0x0;
            local_598[2] = "a";
            local_598[3] = local_5ec;
            local_598[4] = "b";
            local_598[5] = local_5e8;
            local_598[6] = "x";
            local_598[7] = local_5e4;
            local_598[8] = "y";
            local_598[9] = local_5e0;
            local_598[10] = "back";
            local_598[0xb] = local_5d4;
            local_598[0xc] = "start";
            local_598[0xd] = local_5d0;
            local_598[0xe] = "guide";
            local_598[0xf] = local_5cc;
            local_598[0x10] = "leftshoulder";
            local_598[0x11] = local_5dc;
            local_598[0x12] = "rightshoulder";
            local_598[0x13] = local_5d8;
            local_598[0x14] = "leftstick";
            local_598[0x15] = local_5c8;
            local_598[0x16] = "rightstick";
            local_598[0x17] = local_5c4;
            local_598[0x18] = "dpup";
            local_598[0x19] = local_5c0;
            local_598[0x1a] = "dpright";
            local_598[0x1b] = local_5bc;
            local_598[0x1c] = "dpdown";
            local_598[0x1d] = local_5b8;
            local_598[0x1e] = "dpleft";
            local_598[0x1f] = local_5b4;
            local_598[0x20] = "lefttrigger";
            local_598[0x21] = (char *)&local_5a0;
            local_598[0x22] = "righttrigger";
            local_480 = (long)&local_5a0 + 4;
            local_478 = "leftx";
            local_470 = local_5b0;
            local_468 = "lefty";
            local_460 = local_5ac;
            local_458 = "rightx";
            local_450 = local_5a8;
            local_448 = "righty";
            local_440 = local_5a4;
            local_6a8 = (char *)&local_438;
            sVar14 = strcspn((char *)&local_438,",");
            if ((sVar14 == 0x20) && (local_418 == ',')) {
              local_5fd = local_428;
              uStack_5f5 = uStack_420;
              local_60d = local_438;
              uStack_605 = uStack_430;
              sVar14 = strcspn(local_417,",");
              if ((sVar14 < 0x80) && (local_417[sVar14] == ',')) {
                memcpy(local_68d,local_417,sVar14);
                pcVar20 = local_417 + sVar14 + 1;
LAB_001199df:
                ppuVar12 = local_698;
                cVar19 = *pcVar20;
                local_6a8 = pcVar20;
                if ((cVar19 != '-') && (cVar19 != '+')) {
                  if (cVar19 != '\0') goto code_r0x00119a02;
                  lVar21 = 0x80;
                  do {
                    bVar10 = local_68d[lVar21] + 0xbf;
                    bVar23 = local_68d[lVar21 + 1] + 0xbf;
                    bVar24 = local_68d[lVar21 + 2] + 0xbf;
                    bVar25 = local_68d[lVar21 + 3] + 0xbf;
                    bVar26 = local_68d[lVar21 + 4] + 0xbf;
                    bVar27 = local_68d[lVar21 + 5] + 0xbf;
                    bVar28 = local_68d[lVar21 + 6] + 0xbf;
                    bVar29 = local_68d[lVar21 + 7] + 0xbf;
                    bVar2 = (byte)((5 < bVar10) * '\x05' | (5 >= bVar10) * bVar10) == bVar10;
                    bVar3 = (byte)((5 < bVar23) * '\x05' | (5 >= bVar23) * bVar23) == bVar23;
                    bVar4 = (byte)((5 < bVar24) * '\x05' | (5 >= bVar24) * bVar24) == bVar24;
                    bVar5 = (byte)((5 < bVar25) * '\x05' | (5 >= bVar25) * bVar25) == bVar25;
                    bVar6 = (byte)((5 < bVar26) * '\x05' | (5 >= bVar26) * bVar26) == bVar26;
                    bVar7 = (byte)((5 < bVar27) * '\x05' | (5 >= bVar27) * bVar27) == bVar27;
                    bVar8 = (byte)((5 < bVar28) * '\x05' | (5 >= bVar28) * bVar28) == bVar28;
                    bVar9 = (byte)((5 < bVar29) * '\x05' | (5 >= bVar29) * bVar29) == bVar29;
                    if (bVar2) {
                      local_68d[lVar21] = local_68d[lVar21] | 0x20;
                    }
                    if (bVar3) {
                      local_68d[lVar21 + 1] = local_68d[lVar21 + 1] | 0x20;
                    }
                    if (bVar4) {
                      local_68d[lVar21 + 2] = local_68d[lVar21 + 2] | 0x20;
                    }
                    if (bVar5) {
                      local_68d[lVar21 + 3] = local_68d[lVar21 + 3] | 0x20;
                    }
                    if (bVar6) {
                      local_68d[lVar21 + 4] = local_68d[lVar21 + 4] | 0x20;
                    }
                    if (bVar7) {
                      local_68d[lVar21 + 5] = local_68d[lVar21 + 5] | 0x20;
                    }
                    if (bVar8) {
                      local_68d[lVar21 + 6] = local_68d[lVar21 + 6] | 0x20;
                    }
                    if (bVar9) {
                      local_68d[lVar21 + 7] = local_68d[lVar21 + 7] | 0x20;
                    }
                    if (bVar2) {
                      local_68d[lVar21 + 8] = local_68d[lVar21 + 8] | 0x20;
                    }
                    if (bVar3) {
                      local_68d[lVar21 + 9] = local_68d[lVar21 + 9] | 0x20;
                    }
                    if (bVar4) {
                      local_68d[lVar21 + 10] = local_68d[lVar21 + 10] | 0x20;
                    }
                    if (bVar5) {
                      local_68d[lVar21 + 0xb] = local_68d[lVar21 + 0xb] | 0x20;
                    }
                    if (bVar6) {
                      local_68d[lVar21 + 0xc] = local_68d[lVar21 + 0xc] | 0x20;
                    }
                    if (bVar7) {
                      local_68d[lVar21 + 0xd] = local_68d[lVar21 + 0xd] | 0x20;
                    }
                    if (bVar8) {
                      local_68d[lVar21 + 0xe] = local_68d[lVar21 + 0xe] | 0x20;
                    }
                    if (bVar9) {
                      local_68d[lVar21 + 0xf] = local_68d[lVar21 + 0xf] | 0x20;
                    }
                    lVar21 = lVar21 + 0x10;
                  } while (lVar21 != 0xa0);
                  _glfwPlatformUpdateGamepadGUID((char *)&local_60d);
                  p_Var17 = findMapping((char *)&local_60d);
                  if (p_Var17 == (_GLFWmapping *)0x0) {
                    lVar21 = (long)_glfw.mappingCount;
                    _glfw.mappingCount = (int)(lVar21 + 1);
                    _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar21 + 1) * 0xf5);
                    p_Var17 = _glfw.mappings + (long)_glfw.mappingCount + -1;
                  }
                  memcpy(p_Var17,local_68d,0xf5);
                }
                goto LAB_00119bd4;
              }
            }
            _glfwInputError(0x10004,(char *)0x0);
            ppuVar12 = local_698;
          }
LAB_00119bd4:
          string = string + sVar13;
        }
        cVar19 = *string;
      } while (cVar19 != '\0');
    }
    lVar21 = 0;
    do {
      if (*(int *)(_glfw.joysticks[0].guid + lVar21 + -0x48) != 0) {
        p_Var17 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar21 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar21 + -0xc) = p_Var17;
      }
      lVar21 = lVar21 + 0x1fa0;
    } while (lVar21 != 0x1fa00);
    iVar11 = 1;
  }
  return iVar11;
code_r0x00119a02:
  lVar21 = 8;
  do {
    pcVar22 = *(char **)((long)&local_5a0 + lVar21);
    sVar14 = strlen(pcVar22);
    iVar11 = strncmp(pcVar20,pcVar22,sVar14);
    if ((iVar11 == 0) && (pcVar20[sVar14] == ':')) {
      pcVar22 = pcVar20 + sVar14 + 1;
      pcVar1 = *(char **)((long)local_598 + lVar21);
      if (pcVar1 == (char *)0x0) {
        local_6a8 = pcVar22;
        iVar11 = strncmp(pcVar22,"Linux",5);
        ppuVar12 = local_698;
        pcVar20 = pcVar22;
        if (iVar11 != 0) goto LAB_00119bd4;
        break;
      }
      cVar19 = *pcVar22;
      cVar18 = '\x01';
      if (cVar19 == '+') {
        local_69c = 0;
        cVar18 = '\x01';
LAB_00119ae4:
        pcVar22 = pcVar20 + sVar14 + 2;
        cVar19 = pcVar20[sVar14 + 2];
      }
      else {
        if (cVar19 == '-') {
          local_69c = 0xffffffff;
          cVar18 = '\0';
          goto LAB_00119ae4;
        }
        local_69c = 0xffffffff;
      }
      local_6a8 = pcVar22;
      if (cVar19 == 'a') {
        cVar19 = '\x01';
LAB_00119b5d:
        *pcVar1 = cVar19;
        uVar16 = strtoul(pcVar22 + 1,&local_6a8,10);
        bVar10 = (byte)uVar16;
      }
      else {
        if (cVar19 != 'h') {
          pcVar20 = pcVar22;
          if (cVar19 == 'b') {
            cVar19 = '\x02';
            goto LAB_00119b5d;
          }
          break;
        }
        *pcVar1 = '\x03';
        uVar16 = strtoul(pcVar22 + 1,&local_6a8,10);
        uVar15 = strtoul(local_6a8 + 1,&local_6a8,10);
        bVar10 = (byte)(uVar16 << 4) | (byte)uVar15;
      }
      pcVar1[1] = bVar10;
      pcVar20 = local_6a8;
      if (*pcVar1 == '\x01') {
        bVar10 = 2 / (byte)(cVar18 - (char)local_69c);
        pcVar1[2] = bVar10;
        cVar18 = cVar18 + (char)local_69c;
        pcVar1[3] = -cVar18;
        if (*local_6a8 == '~') {
          pcVar1[2] = -bVar10;
          pcVar1[3] = cVar18;
        }
      }
      break;
    }
    lVar21 = lVar21 + 0x10;
  } while (lVar21 != 0x168);
  sVar14 = strcspn(pcVar20,",");
  pcVar20 = pcVar20 + sVar14;
  local_6a8 = pcVar20;
  sVar14 = strspn(pcVar20,",");
  pcVar20 = pcVar20 + sVar14;
  goto LAB_001199df;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if (isxdigit(*c))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}